

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

confirm * __thiscall lest::confirm::operator()(confirm *this,test *testing)

{
  _func_void_env_ptr *p_Var1;
  env *peVar2;
  text local_40;
  
  this->selected = this->selected + 1;
  p_Var1 = testing->behaviour;
  std::__cxx11::string::string((string *)&local_40,&testing->name);
  peVar2 = env::operator()(&this->output,&local_40);
  (*p_Var1)(peVar2);
  std::__cxx11::string::~string((string *)&local_40);
  return this;
}

Assistant:

confirm & operator()( test testing )
    {
        try
        {
            ++selected; testing.behaviour( output( testing.name ) );
        }
        catch( message const & e )
        {
            ++failures; report( os, e, output.context() );
        }
        return *this;
    }